

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  ushort uVar1;
  ushort uVar2;
  u32 uVar3;
  u8 *__src;
  char *__dest;
  bool bVar4;
  ushort uVar5;
  u16 uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  ushort uVar10;
  uint uVar11;
  undefined8 uVar12;
  ushort *puVar13;
  uint uVar14;
  u8 *__src_00;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  u32 uVar18;
  uint uVar19;
  ulong uVar20;
  
  __src = pPage->aData;
  uVar15 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar11 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar3 = pPage->pBt->usableSize;
  if ((int)(uint)__src[uVar15 + 7] <= nMaxFrag) {
    uVar5 = *(ushort *)(__src + uVar15 + 1) << 8 | *(ushort *)(__src + uVar15 + 1) >> 8;
    uVar12 = 0x11ae9;
    if ((int)(uVar3 - 4) < (int)(uint)uVar5) {
LAB_001594ee:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      iVar17 = 1;
      uVar18 = 0xaaaaaaaa;
    }
    else {
      iVar17 = 0;
      uVar18 = 0xaaaaaaaa;
      uVar14 = (uint)uVar5;
      if (uVar5 != 0) {
        uVar10 = *(ushort *)(__src + uVar5) << 8 | *(ushort *)(__src + uVar5) >> 8;
        uVar12 = 0x11aec;
        if ((int)(uint)uVar10 <= (int)(uVar3 - 4)) {
          uVar19 = (uint)uVar10;
          if ((uVar10 != 0) && ((__src[uVar10] != '\0' || (__src[(ulong)uVar10 + 1] != '\0'))))
          goto LAB_0015951a;
          uVar7 = *(ushort *)(__src + uVar15 + 5) << 8 | *(ushort *)(__src + uVar15 + 5) >> 8;
          uVar12 = 0x11af4;
          iVar17 = uVar14 - uVar7;
          if (uVar7 <= uVar14 && iVar17 != 0) {
            uVar8 = *(ushort *)(__src + (ulong)uVar5 + 2) << 8 |
                    *(ushort *)(__src + (ulong)uVar5 + 2) >> 8;
            uVar16 = (uint)uVar8;
            uVar9 = (uint)uVar8 + (uint)uVar5;
            if (uVar19 == 0) {
              uVar5 = 0;
              uVar12 = 0x11afd;
              if ((int)uVar9 <= (int)uVar3) {
LAB_001597a8:
                uVar18 = uVar16 + uVar7;
                memmove(__src + uVar18,__src + uVar7,(long)iVar17);
                iVar17 = 5;
                if (uVar1 < uVar11) {
                  puVar13 = (ushort *)(__src + uVar1);
                  do {
                    uVar8 = *puVar13 << 8 | *puVar13 >> 8;
                    uVar7 = (ushort)uVar16;
                    if ((uVar8 < uVar14) || (uVar7 = uVar5, (uint)uVar8 < (uint)uVar10)) {
                      *puVar13 = (uVar8 + uVar7) * 0x100 | (ushort)(uVar8 + uVar7) >> 8;
                    }
                    puVar13 = puVar13 + 1;
                  } while (puVar13 < __src + uVar11);
                }
                goto LAB_0015951a;
              }
            }
            else {
              uVar12 = 0x11af7;
              if (uVar9 <= uVar19) {
                uVar5 = *(ushort *)(__src + (ulong)uVar10 + 2) << 8 |
                        *(ushort *)(__src + (ulong)uVar10 + 2) >> 8;
                uVar12 = 0x11af9;
                if ((int)((uint)uVar10 + (uint)uVar5) <= (int)uVar3) {
                  memmove(__src + (uVar9 + uVar5),__src + uVar9,(long)(int)(uVar19 - uVar9));
                  uVar16 = (uint)uVar8 + (uint)uVar5;
                  goto LAB_001597a8;
                }
              }
            }
          }
        }
        goto LAB_001594ee;
      }
    }
LAB_0015951a:
    if (iVar17 == 5) goto LAB_0015965c;
    if (iVar17 != 0) {
      return 0xb;
    }
  }
  uVar18 = uVar3;
  if ((ulong)uVar2 != 0) {
    uVar5 = *(ushort *)(__src + uVar15 + 5);
    __dest = pPage->pBt->pPager->pTmpSpace;
    memcpy(__dest,__src,(long)(int)uVar3);
    uVar20 = 0;
    do {
      uVar10 = *(ushort *)(__src + uVar20 * 2 + (ulong)uVar1) << 8 |
               *(ushort *)(__src + uVar20 * 2 + (ulong)uVar1) >> 8;
      if ((int)(uVar3 - 4) < (int)(uint)uVar10) {
        uVar12 = 0x11b1e;
LAB_00159622:
        bVar4 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      }
      else {
        __src_00 = (u8 *)(__dest + (uint)uVar10);
        uVar6 = (*pPage->xCellSize)(pPage,__src_00);
        uVar18 = uVar18 - uVar6;
        if (((int)uVar18 < (int)(uint)(ushort)(uVar5 << 8 | uVar5 >> 8)) ||
           ((int)uVar3 < (int)((uint)uVar10 + (uint)uVar6))) {
          uVar12 = 0x11b24;
          goto LAB_00159622;
        }
        *(ushort *)(__src + uVar20 * 2 + (ulong)uVar1) = (ushort)uVar18 << 8 | (ushort)uVar18 >> 8;
        memcpy(__src + uVar18,__src_00,(ulong)uVar6);
        bVar4 = true;
      }
      if (!bVar4) {
        return 0xb;
      }
      uVar20 = uVar20 + 1;
    } while (uVar2 != uVar20);
  }
  __src[uVar15 + 7] = '\0';
LAB_0015965c:
  if ((uint)__src[uVar15 + 7] + (uVar18 - uVar11) == pPage->nFree) {
    *(ushort *)(__src + uVar15 + 5) = (ushort)uVar18 << 8 | (ushort)uVar18 >> 8;
    (__src + uVar15 + 1)[0] = '\0';
    (__src + uVar15 + 1)[1] = '\0';
    iVar17 = 0;
    memset(__src + uVar11,0,(long)(int)(uVar18 - uVar11));
  }
  else {
    iVar17 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11b32,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  return iVar17;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  if( nCell>0 ){
    temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
    memcpy(temp, data, usableSize);
    src = temp;
    for(i=0; i<nCell; i++){
      u8 *pAddr;     /* The i-th cell pointer */
      pAddr = &data[cellOffset + i*2];
      pc = get2byte(pAddr);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      /* These conditions have already been verified in btreeInitPage()
      ** if PRAGMA cell_size_check=ON.
      */
      if( pc>iCellLast ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( pc>=0 && pc<=iCellLast );
      size = pPage->xCellSize(pPage, &src[pc]);
      cbrk -= size;
      if( cbrk<iCellStart || pc+size>usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( cbrk+size<=usableSize && cbrk>=iCellStart );
      testcase( cbrk+size==usableSize );
      testcase( pc+size==usableSize );
      put2byte(pAddr, cbrk);
      memcpy(&data[cbrk], &src[pc], size);
    }
  }
  data[hdr+7] = 0;

defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}